

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

string * testing::internal::FlagToEnvVar_abi_cxx11_(char *flag)

{
  char cVar1;
  Message *this;
  string *in_RDI;
  size_t i;
  size_type sVar2;
  string full_flag;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  char *local_48;
  string local_40;
  
  Message::Message((Message *)&local_50);
  std::operator<<((ostream *)(local_50._M_head_impl + 0x10),"gtest_");
  this = Message::operator<<((Message *)&local_50,&local_48);
  Message::GetString_abi_cxx11_(&local_40,this);
  if (local_50._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)local_50._M_head_impl + 8))();
  }
  Message::Message((Message *)&local_50);
  for (sVar2 = 0; sVar2 != local_40._M_string_length; sVar2 = sVar2 + 1) {
    cVar1 = ToUpper(local_40._M_dataplus._M_p[sVar2]);
    std::operator<<((ostream *)(local_50._M_head_impl + 0x10),cVar1);
  }
  StringStreamToString(in_RDI,local_50._M_head_impl);
  if (local_50._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)local_50._M_head_impl + 8))(local_50._M_head_impl);
  }
  std::__cxx11::string::~string((string *)&local_40);
  return in_RDI;
}

Assistant:

static std::string FlagToEnvVar(const char* flag) {
  const std::string full_flag =
      (Message() << GTEST_FLAG_PREFIX_ << flag).GetString();

  Message env_var;
  for (size_t i = 0; i != full_flag.length(); i++) {
    env_var << ToUpper(full_flag.c_str()[i]);
  }

  return env_var.GetString();
}